

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O3

uint64_t helper_pdist(uint64_t sum,uint64_t src1,uint64_t src2)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  lVar3 = 0;
  auVar4._8_4_ = (int)src1;
  auVar4._0_8_ = src1;
  auVar4._12_4_ = (int)(src1 >> 0x20);
  auVar5._8_4_ = (int)src2;
  auVar5._0_8_ = src2;
  auVar5._12_4_ = (int)(src2 >> 0x20);
  lVar6 = 0;
  lVar7 = 1;
  lVar2 = 8;
  do {
    lVar10 = lVar6 * -8 + 0x38;
    lVar11 = lVar7 * -8 + 0x38;
    iVar12 = ((uint)(src1 >> lVar10) & 0xff) - ((uint)(src2 >> lVar10) & 0xff);
    iVar13 = ((uint)(auVar4._8_8_ >> lVar11) & 0xff) - ((uint)(auVar5._8_8_ >> lVar11) & 0xff);
    iVar8 = iVar12 >> 0x1f;
    iVar9 = iVar13 >> 0x1f;
    uVar1 = CONCAT44(iVar13,iVar12) ^ CONCAT44(iVar9,iVar8);
    sum = sum + (uint)((int)uVar1 - iVar8);
    lVar3 = lVar3 + (ulong)(uint)((int)(uVar1 >> 0x20) - iVar9);
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
    lVar2 = lVar2 + -2;
  } while (lVar2 != 0);
  return lVar3 + sum;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}